

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<long>_>::
UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long>::Right
          (UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long> *this,
          idx_t begin,idx_t end)

{
  unsigned_long *puVar1;
  ModeState<long,_duckdb::ModeStandard<long>_> *pMVar2;
  ColumnDataScanState *pCVar3;
  reference pvVar4;
  ColumnDataScanState *pCVar5;
  
  if (begin < end) {
    do {
      puVar1 = (this->included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[begin >> 6] >> (begin & 0x3f) & 1) != 0)) {
        pMVar2 = this->included->state;
        pCVar3 = pMVar2->scan;
        if ((begin < (ColumnDataScanState *)pCVar3->next_row_index) &&
           (pCVar5 = (ColumnDataScanState *)pCVar3->current_row_index, pCVar5 <= begin)) {
          pvVar4 = (reference)pMVar2->validity;
        }
        else {
          duckdb::ColumnDataCollection::Seek
                    ((ulong)pMVar2->inputs,(ColumnDataScanState *)begin,(DataChunk *)pCVar3);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pMVar2->page,0);
          pMVar2->data = *(long **)(pvVar4 + 0x20);
          pvVar4 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)&pMVar2->page,0);
          FlatVector::VerifyFlatVector(pvVar4);
          pvVar4 = pvVar4 + 0x28;
          pMVar2->validity = (ValidityMask *)pvVar4;
          pCVar5 = (ColumnDataScanState *)pMVar2->scan->current_row_index;
        }
        if ((*(long *)pvVar4 == 0) ||
           ((*(ulong *)(*(long *)pvVar4 + (begin - (long)pCVar5 >> 6 & 0x3ffffff) * 8) >>
             (begin - (long)pCVar5 & 0x3f) & 1) != 0)) {
          ModeState<long,_duckdb::ModeStandard<long>_>::ModeAdd(this->state,begin);
        }
      }
      begin = (long)&(((ColumnDataScanState *)begin)->current_chunk_state).handles._M_h._M_buckets +
              1;
    } while (end != begin);
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeAdd(begin);
				}
			}
		}